

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileSystemWatcher_inotify.cpp
# Opt level: O3

bool __thiscall FileSystemWatcher::unwatch(FileSystemWatcher *this,Path *path)

{
  int iVar1;
  int wd;
  int local_24;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->mMutex);
  if (iVar1 == 0) {
    local_24 = -1;
    iVar1 = Map<Path,_int,_std::less<Path>_>::remove(&this->mWatchedByPath,(char *)path);
    if (SUB41(iVar1,0) != false) {
      debug("FileSystemWatcher::unwatch(\"%s\")",(path->super_String).mString._M_dataplus._M_p);
      Map<int,_Path,_std::less<int>_>::remove(&this->mWatchedById,(char *)&local_24);
      inotify_rm_watch(this->mFd,local_24);
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->mMutex);
    return SUB41(iVar1,0);
  }
  std::__throw_system_error(iVar1);
}

Assistant:

bool FileSystemWatcher::unwatch(const Path &path)
{
    std::lock_guard<std::mutex> lock(mMutex);
    int wd = -1;
    if (mWatchedByPath.remove(path, &wd)) {
        debug("FileSystemWatcher::unwatch(\"%s\")", path.constData());
        mWatchedById.remove(wd);
        inotify_rm_watch(mFd, wd);
        return true;
    } else {
        return false;
    }
}